

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O2

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  int iVar1;
  int iVar2;
  unsigned_long numFrames;
  pthread_t __thread1;
  void *__dest;
  long lVar3;
  char *pcVar4;
  unsigned_long framesGot;
  PaError local_50;
  int xrun;
  undefined8 local_48;
  void *local_40;
  unsigned_long framesAvail;
  
  lVar3 = *(long *)((long)s + 0x2c0);
  local_48 = *(undefined8 *)((long)s + 0x340);
  if (lVar3 == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4387\n"
                     );
    local_50 = -0x26f7;
  }
  else {
    *(undefined8 *)((long)s + 0x340) = 0;
    local_50 = 0;
    if (0.0 < *(double *)((long)s + 0x280)) {
      *(undefined8 *)((long)s + 0x280) = 0;
      local_50 = -0x26fd;
    }
    __dest = buffer;
    if (*(int *)((long)s + 0x298) == 0) {
      __dest = *(void **)((long)s + 0x2e8);
      memcpy(__dest,buffer,(long)*(int *)((long)s + 0x290) << 3);
      lVar3 = *(long *)((long)s + 0x2c0);
    }
    local_40 = __dest;
    iVar1 = snd_pcm_state(lVar3);
    if ((iVar1 == 2) && (iVar1 = snd_pcm_start(*(undefined8 *)((long)s + 0x2c0)), iVar1 < 0)) {
      __thread1 = pthread_self();
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar2 != 0) {
        pcVar4 = (char *)snd_strerror(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,pcVar4);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4412\n"
                       );
      local_50 = -9999;
    }
    else {
      while (frames != 0) {
        xrun = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames((PaAlsaStream *)s,&framesAvail,&xrun);
        if (paUtilErr_ < 0) {
          pcVar4 = 
          "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4418\n"
          ;
          goto LAB_0010d1c0;
        }
        framesGot = framesAvail;
        if (frames <= framesAvail) {
          framesGot = frames;
        }
        paUtilErr_ = PaAlsaStream_SetUpBuffers((PaAlsaStream *)s,&framesGot,&xrun);
        if (paUtilErr_ < 0) {
          pcVar4 = 
          "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4421\n"
          ;
          goto LAB_0010d1c0;
        }
        if (framesGot != 0) {
          numFrames = PaUtil_CopyInput((PaUtilBufferProcessor *)((long)s + 0x68),&local_40,framesGot
                                      );
          framesGot = numFrames;
          paUtilErr_ = PaAlsaStream_EndProcessing((PaAlsaStream *)s,numFrames,&xrun);
          if (paUtilErr_ < 0) {
            pcVar4 = 
            "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4425\n"
            ;
LAB_0010d1c0:
            PaUtil_DebugPrint(pcVar4);
            local_50 = paUtilErr_;
            break;
          }
          frames = frames - numFrames;
        }
      }
    }
  }
  *(undefined8 *)((long)s + 0x340) = local_48;
  return local_50;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}